

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ihevcd_bitstream.c
# Opt level: O2

void ihevcd_bits_seek(bitstrm_t *ps_bitstrm,WORD32 numbits)

{
  uint uVar1;
  uint *puVar2;
  UWORD32 *pUVar3;
  uint uVar4;
  
  if (numbits < -0x20) {
    __assert_fail("(numbits >= -32)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_bitstream.c"
                  ,0xe6,"void ihevcd_bits_seek(bitstrm_t *, WORD32)");
  }
  if (numbits < 0x21) {
    if (numbits < 0) {
      uVar4 = ps_bitstrm->u4_bit_ofst;
      if (uVar4 < (uint)-numbits) {
        ps_bitstrm->u4_bit_ofst = uVar4 + numbits + 0x20;
        pUVar3 = ps_bitstrm->pu4_buf;
        ps_bitstrm->pu4_buf = pUVar3 + -1;
        uVar4 = pUVar3[-3];
        ps_bitstrm->u4_nxt_word = ps_bitstrm->u4_cur_word;
        ps_bitstrm->u4_cur_word =
             uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
      }
      else {
        ps_bitstrm->u4_bit_ofst = uVar4 + numbits;
      }
    }
    else {
      uVar4 = numbits + ps_bitstrm->u4_bit_ofst;
      ps_bitstrm->u4_bit_ofst = uVar4;
      if (0x1f < uVar4) {
        ps_bitstrm->u4_cur_word = ps_bitstrm->u4_nxt_word;
        puVar2 = ps_bitstrm->pu4_buf;
        ps_bitstrm->pu4_buf = puVar2 + 1;
        uVar1 = *puVar2;
        ps_bitstrm->u4_bit_ofst = uVar4 - 0x20;
        ps_bitstrm->u4_nxt_word =
             uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
      }
    }
    return;
  }
  __assert_fail("(numbits <= 32)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Zhziyao[P]libhevctest/decoder/ihevcd_bitstream.c"
                ,0xe7,"void ihevcd_bits_seek(bitstrm_t *, WORD32)");
}

Assistant:

void ihevcd_bits_seek(bitstrm_t *ps_bitstrm, WORD32 numbits)
{
    WORD32 val;
    ASSERT(numbits >= -32);
    ASSERT(numbits <= 32);
    /* Check if Seeking backwards*/
    if(numbits < 0)
    {
        UWORD32 abs_numbits = -numbits;
        if(ps_bitstrm->u4_bit_ofst >= abs_numbits)
        {
            /* If the current offset is greater than number of bits to seek back,
             * then subtract abs_numbits from offset and return.
             */
            ps_bitstrm->u4_bit_ofst -= abs_numbits;
            return;
        }
        else
        {
            /* If the current offset is lesser than number of bits to seek back,
             * then subtract abs_numbits from offset and add 32 and move cur_word to nxt_word
             * and load cur_word appropriately and decrement pu4_buf
             */
            ps_bitstrm->u4_bit_ofst -= abs_numbits;
            ps_bitstrm->u4_bit_ofst += 32;
            ps_bitstrm->pu4_buf--;

            val = *(ps_bitstrm->pu4_buf - 2);
            ps_bitstrm->u4_nxt_word = ps_bitstrm->u4_cur_word;
            ps_bitstrm->u4_cur_word = ITT_BIG_ENDIAN(val);
            return;
        }
    }
    else
    {
        /* Not supported/tested currently */
        ASSERT(1);
        BITS_FLUSH(ps_bitstrm->pu4_buf,
                   ps_bitstrm->u4_bit_ofst,
                   ps_bitstrm->u4_cur_word,
                   ps_bitstrm->u4_nxt_word,
                   numbits);


    }
    return;
}